

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O0

int __thiscall cmCPackExternalGenerator::PackageFiles(cmCPackExternalGenerator *this)

{
  cmCPackLog *this_00;
  cmMakefile *this_01;
  bool bVar1;
  int iVar2;
  Value *this_02;
  reference pvVar3;
  char *pcVar4;
  StreamWriter *__p;
  pointer pcVar5;
  pointer pSVar6;
  string *psVar7;
  ostream *this_03;
  allocator<char> local_509;
  string local_508;
  cmValue local_4e8;
  cmValue builtPackages;
  string local_4d8 [7];
  bool res;
  undefined1 local_4b8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_331;
  string local_330;
  cmValue local_310;
  cmValue packageScript;
  undefined1 local_300 [8];
  Value root;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> jout;
  ofstream fout;
  string local_c8 [8];
  string filename;
  String local_a0;
  Value local_70;
  undefined1 local_48 [8];
  StreamWriterBuilder builder;
  cmCPackExternalGenerator *this_local;
  
  builder.settings_.limit_ = (ptrdiff_t)this;
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_48);
  Json::Value::Value(&local_70,"  ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"indentation",
             (allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  this_02 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_48,&local_a0);
  Json::Value::operator=(this_02,&local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  Json::Value::~Value(&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"package.json",(allocator<char> *)&fout.field_0x1ff);
  std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x1ff);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->super_cmCPackGenerator).packageFileNames);
  if (!bVar1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::__cxx11::string::operator=(local_c8,(string *)pvVar3);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&jout,pcVar4,_S_out);
  __p = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_48);
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)&root.limit_,
             __p);
  Json::Value::Value((Value *)local_300,objectValue);
  pcVar5 = std::
           unique_ptr<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           ::operator->(&this->Generator);
  iVar2 = (*pcVar5->_vptr_cmCPackExternalVersionGenerator[2])(pcVar5,local_300);
  if (iVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pSVar6 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::
             operator->((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)
                        &root.limit_);
    iVar2 = (*pSVar6->_vptr_StreamWriter[2])(pSVar6,local_300,&jout);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"CPACK_EXTERNAL_PACKAGE_SCRIPT",&local_331);
      local_310 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      bVar1 = cmNonempty(local_310);
      if (bVar1) {
        psVar7 = cmValue::operator_cast_to_string_(&local_310);
        bVar1 = cmsys::SystemTools::FileIsFullPath(psVar7);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
          this_03 = std::operator<<((ostream *)local_4b8,
                                    "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
                                   );
          std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
          this_00 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(this_00,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                          ,0x46,pcVar4);
          std::__cxx11::string::~string(local_4d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
          this_local._4_4_ = 0;
          goto LAB_001e01f4;
        }
        this_01 = (this->super_cmCPackGenerator).MakefileMap;
        psVar7 = cmValue::operator_cast_to_string_(&local_310);
        builtPackages.Value._7_1_ = cmMakefile::ReadListFile(this_01,psVar7);
        bVar1 = cmSystemTools::GetErrorOccurredFlag();
        if ((bVar1) || ((builtPackages.Value._7_1_ & 1) == 0)) {
          this_local._4_4_ = 0;
          goto LAB_001e01f4;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_508,"CPACK_EXTERNAL_BUILT_PACKAGES",&local_509);
        local_4e8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
        bVar1 = cmValue::operator_cast_to_bool(&local_4e8);
        if (bVar1) {
          cmExpandList(local_4e8,&(this->super_cmCPackGenerator).packageFileNames,false);
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
LAB_001e01f4:
  packageScript.Value._4_4_ = 1;
  Json::Value::~Value((Value *)local_300);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            ((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)
             &root.limit_);
  std::ofstream::~ofstream(&jout);
  std::__cxx11::string::~string(local_c8);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_48);
  return this_local._4_4_;
}

Assistant:

int cmCPackExternalGenerator::PackageFiles()
{
  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";

  std::string filename = "package.json";
  if (!this->packageFileNames.empty()) {
    filename = this->packageFileNames[0];
  }

  cmsys::ofstream fout(filename.c_str());
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());

  Json::Value root(Json::objectValue);

  if (!this->Generator->WriteToJSON(root)) {
    return 0;
  }

  if (jout->write(root, &fout)) {
    return 0;
  }

  cmValue packageScript = this->GetOption("CPACK_EXTERNAL_PACKAGE_SCRIPT");
  if (cmNonempty(packageScript)) {
    if (!cmSystemTools::FileIsFullPath(packageScript)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
          << std::endl);
      return 0;
    }

    bool res = this->MakefileMap->ReadListFile(packageScript);

    if (cmSystemTools::GetErrorOccurredFlag() || !res) {
      return 0;
    }

    cmValue builtPackages = this->GetOption("CPACK_EXTERNAL_BUILT_PACKAGES");
    if (builtPackages) {
      cmExpandList(builtPackages, this->packageFileNames, false);
    }
  }

  return 1;
}